

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void regenerate(ImGuiWS *imguiWS,int time)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  size_type __n;
  int in_ESI;
  int i_2;
  vector<char,_std::allocator<char>_> texture0_2;
  int height_2;
  int width_2;
  int i_1;
  vector<char,_std::allocator<char>_> texture0_1;
  int height_1;
  int width_1;
  int i;
  vector<char,_std::allocator<char>_> texture0;
  int height;
  int width;
  undefined4 in_stack_ffffffffffffff00;
  value_type in_stack_ffffffffffffff04;
  value_type in_stack_ffffffffffffff05;
  value_type in_stack_ffffffffffffff06;
  value_type in_stack_ffffffffffffff07;
  size_type in_stack_ffffffffffffff08;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  vector<char,_std::allocator<char>_> *this;
  int local_98;
  undefined1 local_91 [25];
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar5;
  int32_t in_stack_ffffffffffffff90;
  int32_t in_stack_ffffffffffffff94;
  Type in_stack_ffffffffffffff98;
  TextureId in_stack_ffffffffffffff9c;
  ImGuiWS *in_stack_ffffffffffffffa0;
  int local_48;
  allocator<char> local_31;
  vector<char,_std::allocator<char>_> local_30;
  int local_14;
  int local_10;
  int local_c;
  
  local_10 = 0x10;
  local_14 = 0x10;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (allocator_type *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,
                                        CONCAT14(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                )))));
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < local_10 * local_14; local_48 = local_48 + 1) {
    iVar1 = rand();
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_30,(long)local_48);
    *pvVar4 = (value_type)(iVar1 % 0x100);
  }
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x10c972);
  ImGuiWS::setTexture(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                      in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                      (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,
                                        CONCAT14(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                )))));
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (allocator_type *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,
                                        CONCAT14(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                )))));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  for (iVar1 = 0; iVar1 < 0x400; iVar1 = iVar1 + 1) {
    iVar2 = iVar1 * 10 + local_c;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff98,
                        (long)(iVar1 * 3));
    *pvVar4 = (value_type)(iVar2 % 0xff);
    iVar2 = iVar1 * 0xd + local_c;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff98,
                        (long)(iVar1 * 3 + 1));
    *pvVar4 = (value_type)(iVar2 % 0xff);
    iVar2 = iVar1 * 0x13 + local_c;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff98,
                        (long)(iVar1 * 3 + 2));
    *pvVar4 = (value_type)(iVar2 % 0xff);
  }
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x10cb8a);
  ImGuiWS::setTexture(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                      in_stack_ffffffffffffff94,iVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,
                                        CONCAT14(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                )))));
  iVar5 = 0x40;
  iVar2 = 0x40;
  __n = 0x4000;
  this = (vector<char,_std::allocator<char>_> *)local_91;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (this,__n,(allocator_type *)
                      CONCAT17(in_stack_ffffffffffffff07,
                               CONCAT16(in_stack_ffffffffffffff06,
                                        CONCAT15(in_stack_ffffffffffffff05,
                                                 CONCAT14(in_stack_ffffffffffffff04,
                                                          in_stack_ffffffffffffff00)))));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  for (local_98 = 0; local_98 < iVar5 * iVar2; local_98 = local_98 + 1) {
    iVar3 = rand();
    in_stack_ffffffffffffff04 = (value_type)(iVar3 % 0x100);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(local_91 + 1),(long)(local_98 << 2))
    ;
    *pvVar4 = in_stack_ffffffffffffff04;
    iVar3 = rand();
    in_stack_ffffffffffffff05 = (value_type)(iVar3 % 0x100);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(local_91 + 1),
                        (long)(local_98 * 4 + 1));
    *pvVar4 = in_stack_ffffffffffffff05;
    iVar3 = rand();
    in_stack_ffffffffffffff06 = (value_type)(iVar3 % 0x100);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(local_91 + 1),
                        (long)(local_98 * 4 + 2));
    *pvVar4 = in_stack_ffffffffffffff06;
    in_stack_ffffffffffffff07 = (value_type)((local_98 * 0x13 + local_c) % 0xff);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(local_91 + 1),
                        (long)(local_98 * 4 + 3));
    *pvVar4 = in_stack_ffffffffffffff07;
  }
  iVar3 = iVar2;
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x10cdc8);
  ImGuiWS::setTexture(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                      in_stack_ffffffffffffff94,iVar1,(char *)CONCAT44(iVar5,iVar3));
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,
                                        CONCAT14(in_stack_ffffffffffffff04,iVar2)))));
  return;
}

Assistant:

void regenerate(ImGuiWS & imguiWS, int time) {
    {
        // texture sizes must be powers of 2
        int width = 16;
        int height = 16;
        std::vector<char> texture0(width*height);
        for (int i = 0; i < width*height; ++i) {
            texture0[i] = rand()%256;
        }
        imguiWS.setTexture(g_texture0Id, ImGuiWS::Texture::Type::Gray8, width, height, (const char *) texture0.data());
    }

    {
        int width = 32;
        int height = 32;
        std::vector<char> texture0(3*width*height);
        for (int i = 0; i < width*height; ++i) {
            texture0[3*i + 0] = (i*10 + time)%255;
            texture0[3*i + 1] = (i*13 + time)%255;
            texture0[3*i + 2] = (i*19 + time)%255;
        }
        imguiWS.setTexture(g_texture1Id, ImGuiWS::Texture::Type::RGB24, width, height, (const char *) texture0.data());
    }

    {
        int width = 64;
        int height = 64;
        std::vector<char> texture0(4*width*height);
        for (int i = 0; i < width*height; ++i) {
            texture0[4*i + 0] = rand()%256;
            texture0[4*i + 1] = rand()%256;
            texture0[4*i + 2] = rand()%256;
            texture0[4*i + 3] = (i*19 + time)%255;
        }
        imguiWS.setTexture(g_texture2Id, ImGuiWS::Texture::Type::RGBA32, width, height, (const char *) texture0.data());
    }
}